

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrActionSetCreateInfo *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string type_prefix;
  string priority_prefix;
  string localizedactionsetname_prefix;
  string actionsetname_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream oss_priority;
  
  PointerToHexString<XrActionSetCreateInfo>((XrActionSetCreateInfo *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_priority);
  std::__cxx11::string::~string((string *)&oss_priority);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_priority,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_priority);
    std::__cxx11::string::~string((string *)&oss_priority);
  }
  else {
    _oss_priority = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_priority);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_priority);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_1c8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1c8,contents);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&actionsetname_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&actionsetname_prefix);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,char_const(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])0x20fc54,&actionsetname_prefix,&value->actionSetName);
    std::__cxx11::string::string((string *)&localizedactionsetname_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&localizedactionsetname_prefix);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,char_const(&)[128]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])0x20fc54,&localizedactionsetname_prefix,
               &value->localizedActionSetName);
    std::__cxx11::string::string((string *)&priority_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&priority_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_priority);
    poVar4 = std::operator<<((ostream *)&oss_priority,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&priority_prefix,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_priority);
    std::__cxx11::string::~string((string *)&priority_prefix);
    std::__cxx11::string::~string((string *)&localizedactionsetname_prefix);
    std::__cxx11::string::~string((string *)&actionsetname_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrActionSetCreateInfo* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string actionsetname_prefix = prefix;
        actionsetname_prefix += "actionSetName";
        contents.emplace_back("char*", actionsetname_prefix, value->actionSetName);
        std::string localizedactionsetname_prefix = prefix;
        localizedactionsetname_prefix += "localizedActionSetName";
        contents.emplace_back("char*", localizedactionsetname_prefix, value->localizedActionSetName);
        std::string priority_prefix = prefix;
        priority_prefix += "priority";
        std::ostringstream oss_priority;
        oss_priority << "0x" << std::hex << (value->priority);
        contents.emplace_back("uint32_t", priority_prefix, oss_priority.str());
        return true;
    } catch(...) {
    }
    return false;
}